

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O2

string * deqp::gles2::Performance::singleVaryingVertexTemplate_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)in_RDI,
             "attribute highp vec4 a_position${NAME_SPEC};\nattribute mediump vec4 a_value${NAME_SPEC};\nvarying mediump vec4 v_value${NAME_SPEC};\n\nvoid main()\n{\n\tgl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n\tv_value${NAME_SPEC} = a_value${NAME_SPEC};\n${SEMANTIC_ERROR}}\n${INVALID_CHAR}"
             ,&local_9);
  return in_RDI;
}

Assistant:

static string singleVaryingVertexTemplate (void)
{
	const char* resultTemplate =
		"attribute highp vec4 a_position${NAME_SPEC};\n"
		"attribute mediump vec4 a_value${NAME_SPEC};\n"
		"varying mediump vec4 v_value${NAME_SPEC};\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n"
		"	v_value${NAME_SPEC} = a_value${NAME_SPEC};\n"
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}